

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_vec3f ma_vec3f_normalize(ma_vec3f v)

{
  float fVar1;
  ma_vec3f mVar2;
  undefined8 local_58;
  undefined4 local_50;
  float l;
  float f;
  undefined8 local_20;
  ma_vec3f v_local;
  undefined4 local_c;
  
  fVar1 = ma_vec3f_len(v);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar1 = 1.0 / fVar1;
    local_20._0_4_ = v.x;
    local_20._4_4_ = v.y;
    local_c = fVar1 * v.z;
    v_local.y = fVar1 * (float)local_20;
    v_local.z = fVar1 * local_20._4_4_;
  }
  else {
    mVar2 = ma_vec3f_init_3f(0.0,0.0,0.0);
    local_58 = mVar2._0_8_;
    v_local.y = (float)local_58;
    v_local.z = local_58._4_4_;
    local_50 = mVar2.z;
    local_c = local_50;
  }
  mVar2.z = local_c;
  mVar2.x = v_local.y;
  mVar2.y = v_local.z;
  return mVar2;
}

Assistant:

MA_API ma_vec3f ma_vec3f_normalize(ma_vec3f v)
{
    float f;
    float l = ma_vec3f_len(v);
    if (l == 0) {
        return ma_vec3f_init_3f(0, 0, 0);
    }

    f = 1 / l;
    v.x *= f;
    v.y *= f;
    v.z *= f;

    return v;
}